

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# algorithm_suite.cpp
# Opt level: O0

void lower_bound_sorted_suite::find_even_last_predicate(void)

{
  iterator pvVar1;
  iterator pvVar2;
  iterator local_78;
  undefined4 local_6c;
  int *local_68 [2];
  int *local_58;
  undefined4 local_4c;
  int *local_48 [2];
  int *local_38;
  undefined4 local_2c;
  int *local_28 [2];
  undefined1 local_18 [8];
  array<int,_4UL> storage;
  
  local_18._0_4_ = 0x2c;
  local_18._4_4_ = 0x21;
  storage._M_elems[0] = 0x16;
  storage._M_elems[1] = 0xb;
  pvVar1 = std::array<int,_4UL>::begin((array<int,_4UL> *)local_18);
  pvVar2 = std::array<int,_4UL>::end((array<int,_4UL> *)local_18);
  local_2c = 0xc;
  local_28[0] = vista::lower_bound_sorted<int*,int,std::greater<int>>(pvVar1,pvVar2,&local_2c);
  pvVar1 = std::array<int,_4UL>::begin((array<int,_4UL> *)local_18);
  local_38 = std::next<int*>(pvVar1,3);
  boost::detail::test_with_impl<boost::detail::lw_test_eq,int*,int*>
            ("lower_bound_sorted(storage.begin(), storage.end(), 12, std::greater<int>{})",
             "std::next(storage.begin(), 3)",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]vista/test/algorithm_suite.cpp"
             ,0x3f3,"void lower_bound_sorted_suite::find_even_last_predicate()",local_28,&local_38);
  pvVar1 = std::array<int,_4UL>::begin((array<int,_4UL> *)local_18);
  pvVar2 = std::array<int,_4UL>::end((array<int,_4UL> *)local_18);
  local_4c = 0xb;
  local_48[0] = vista::lower_bound_sorted<int*,int,std::greater<int>>(pvVar1,pvVar2,&local_4c);
  pvVar1 = std::array<int,_4UL>::begin((array<int,_4UL> *)local_18);
  local_58 = std::next<int*>(pvVar1,3);
  boost::detail::test_with_impl<boost::detail::lw_test_eq,int*,int*>
            ("lower_bound_sorted(storage.begin(), storage.end(), 11, std::greater<int>{})",
             "std::next(storage.begin(), 3)",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]vista/test/algorithm_suite.cpp"
             ,0x3f5,"void lower_bound_sorted_suite::find_even_last_predicate()",local_48,&local_58);
  pvVar1 = std::array<int,_4UL>::begin((array<int,_4UL> *)local_18);
  pvVar2 = std::array<int,_4UL>::end((array<int,_4UL> *)local_18);
  local_6c = 10;
  local_68[0] = vista::lower_bound_sorted<int*,int,std::greater<int>>(pvVar1,pvVar2,&local_6c);
  local_78 = std::array<int,_4UL>::end((array<int,_4UL> *)local_18);
  boost::detail::test_with_impl<boost::detail::lw_test_eq,int*,int*>
            ("lower_bound_sorted(storage.begin(), storage.end(), 10, std::greater<int>{})",
             "storage.end()",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]vista/test/algorithm_suite.cpp"
             ,0x3f7,"void lower_bound_sorted_suite::find_even_last_predicate()",local_68,&local_78);
  return;
}

Assistant:

void find_even_last_predicate()
{
    std::array<int, 4> storage = { 44, 33, 22, 11 };
    BOOST_TEST_EQ(lower_bound_sorted(storage.begin(), storage.end(), 12, std::greater<int>{}),
                  std::next(storage.begin(), 3));
    BOOST_TEST_EQ(lower_bound_sorted(storage.begin(), storage.end(), 11, std::greater<int>{}),
                  std::next(storage.begin(), 3));
    BOOST_TEST_EQ(lower_bound_sorted(storage.begin(), storage.end(), 10, std::greater<int>{}),
                  storage.end());
}